

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::Dictionary(Dictionary *this,shared_ptr<fasttext::Args> *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer __s;
  undefined1 auVar3 [16];
  
  p_Var2 = (args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  p_Var1 = (args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  __s = (pointer)operator_new(120000000);
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = __s;
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 30000000;
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s + 30000000;
  (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->nwords_ = 0;
  this->nlabels_ = 0;
  auVar3 = ZEXT416(0) << 0x40;
  this->ntokens_ = auVar3._0_8_;
  this->nids_ = auVar3._8_8_;
  this->pruneidx_size_ = -1;
  (this->pruneidx_)._M_h._M_buckets = &(this->pruneidx_)._M_h._M_single_bucket;
  (this->pruneidx_)._M_h._M_bucket_count = 1;
  (this->pruneidx_)._M_h._M_before_begin = (__node_base)auVar3._0_8_;
  (this->pruneidx_)._M_h._M_element_count = auVar3._8_8_;
  (this->pruneidx_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->pruneidx_)._M_h._M_rehash_policy._M_next_resize = auVar3;
  memset(__s,0xff,120000000);
  return;
}

Assistant:

Dictionary::Dictionary(std::shared_ptr<Args> args)
		: args_(args),
			word2int_(MAX_VOCAB_SIZE, -1),
			size_(0),
			nwords_(0),
			nlabels_(0),
			ntokens_(0),
			nids_(0),
			pruneidx_size_(-1) {
				std::fill(word2int_.begin(), word2int_.end(), -1);
			}